

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers_iforest.hpp
# Opt level: O0

void add_separation_step<InputData<float,long>,WorkerMemory<ImputedData<long,long_double>,long_double,float>>
               (WorkerMemory<ImputedData<long,_long_double>,_long_double,_float> *workspace,
               InputData<float,_long> *input_data,double remainder)

{
  size_t st;
  size_t end;
  size_t n;
  bool bVar1;
  unsigned_long *puVar2;
  double *counter;
  long in_RSI;
  long in_RDI;
  double in_XMM0_Qa;
  double unaff_retaddr;
  robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
  *in_stack_00000008;
  double *in_stack_00000010;
  size_t in_stack_00000018;
  size_t in_stack_00000020;
  size_t in_stack_00000028;
  size_t *in_stack_00000030;
  double *in_stack_ffffffffffffff78;
  double *in_stack_ffffffffffffff80;
  size_t in_stack_ffffffffffffff88;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff90;
  size_t in_stack_ffffffffffffff98;
  
  if ((*(byte *)(in_RDI + 0xe8) & 1) == 0) {
    puVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x561b68);
    st = *(size_t *)(in_RDI + 0x58);
    end = *(size_t *)(in_RDI + 0x60);
    n = *(size_t *)(in_RSI + 0x30);
    counter = std::vector<double,_std::allocator<double>_>::data
                        ((vector<double,_std::allocator<double>_> *)0x561bb1);
    increase_comb_counter(puVar2,st,end,n,counter,in_XMM0_Qa);
  }
  else {
    bVar1 = std::vector<double,_std::allocator<double>_>::empty(in_stack_ffffffffffffff90);
    if (bVar1) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x561c9c);
      std::vector<double,_std::allocator<double>_>::data
                ((vector<double,_std::allocator<double>_> *)0x561ce5);
      increase_comb_counter
                (in_stack_00000030,in_stack_00000028,in_stack_00000020,in_stack_00000018,
                 in_stack_00000010,in_stack_00000008,unaff_retaddr);
    }
    else {
      puVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x561c01);
      std::vector<double,_std::allocator<double>_>::data
                ((vector<double,_std::allocator<double>_> *)0x561c4a);
      std::vector<double,_std::allocator<double>_>::data
                ((vector<double,_std::allocator<double>_> *)0x561c63);
      increase_comb_counter
                (puVar2,in_stack_ffffffffffffff98,(size_t)in_stack_ffffffffffffff90,
                 in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
                 2.78821105387178e-317);
    }
  }
  return;
}

Assistant:

void add_separation_step(WorkerMemory &workspace, InputData &input_data, double remainder)
{
    if (!workspace.changed_weights)
        increase_comb_counter(workspace.ix_arr.data(), workspace.st, workspace.end,
                              input_data.nrows, workspace.tmat_sep.data(), remainder);
    else if (!workspace.weights_arr.empty())
        increase_comb_counter(workspace.ix_arr.data(), workspace.st, workspace.end,
                              input_data.nrows, workspace.tmat_sep.data(), workspace.weights_arr.data(), remainder);
    else
        increase_comb_counter(workspace.ix_arr.data(), workspace.st, workspace.end,
                              input_data.nrows, workspace.tmat_sep.data(), workspace.weights_map, remainder);
}